

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O1

State __thiscall QAccessibleMenuItem::state(QAccessibleMenuItem *this)

{
  Data *pDVar1;
  char cVar2;
  int iVar3;
  QMenu *this_00;
  QAction *pQVar4;
  QMenuBar *this_01;
  QStyle *pQVar5;
  State SVar6;
  QWidget *this_02;
  uint uVar7;
  uint uVar8;
  
  pDVar1 = (this->m_owner).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    this_02 = (QWidget *)0x0;
  }
  else {
    this_02 = (QWidget *)(this->m_owner).wp.value;
  }
  uVar8 = 0;
  if ((this_02 != (QWidget *)0x0) &&
     (((this_02->data->widget_attributes & 0x8000) == 0 ||
      (cVar2 = QAction::isVisible(), uVar8 = 0, cVar2 == '\0')))) {
    uVar8 = 0x20000;
  }
  this_00 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  if (this_00 == (QMenu *)0x0) {
    this_01 = (QMenuBar *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    uVar7 = uVar8;
    if (this_01 == (QMenuBar *)0x0) goto LAB_0052365b;
    pQVar4 = QMenuBar::activeAction(this_01);
  }
  else {
    pQVar4 = QMenu::activeAction(this_00);
  }
  uVar7 = uVar8 | 8;
  if (pQVar4 != this->m_action) {
    uVar7 = uVar8;
  }
LAB_0052365b:
  uVar8 = uVar7;
  if (this_02 != (QWidget *)0x0) {
    pQVar5 = QWidget::style(this_02);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x14,0,this_02,0);
    uVar8 = uVar7 | 0x200;
    if (iVar3 == 0) {
      uVar8 = uVar7;
    }
  }
  cVar2 = QAction::isSeparator();
  if ((cVar2 != '\0') || (cVar2 = QAction::isEnabled(), cVar2 == '\0')) {
    uVar8 = uVar8 | 1;
  }
  cVar2 = QAction::isChecked();
  uVar7 = uVar8 | 0x40;
  if (cVar2 == '\0') {
    uVar7 = uVar8;
  }
  cVar2 = QAction::isCheckable();
  uVar8 = uVar7 | 0x20;
  if (cVar2 == '\0') {
    uVar8 = uVar7;
  }
  SVar6._4_4_ = 0;
  SVar6._0_4_ = uVar8;
  return SVar6;
}

Assistant:

QAccessible::State QAccessibleMenuItem::state() const
{
    QAccessible::State s;
    QWidget *own = owner();

    if (own && (own->testAttribute(Qt::WA_WState_Visible) == false || m_action->isVisible() == false)) {
        s.invisible = true;
    }

    if (QMenu *menu = qobject_cast<QMenu*>(own)) {
        if (menu->activeAction() == m_action)
            s.focused = true;
#if QT_CONFIG(menubar)
    } else if (QMenuBar *menuBar = qobject_cast<QMenuBar*>(own)) {
        if (menuBar->activeAction() == m_action)
            s.focused = true;
#endif
    }
    if (own && own->style()->styleHint(QStyle::SH_Menu_MouseTracking, nullptr, own))
        s.hotTracked = true;
    if (m_action->isSeparator() || !m_action->isEnabled())
        s.disabled = true;
    if (m_action->isChecked())
        s.checked = true;
    if (m_action->isCheckable())
        s.checkable = true;

    return s;
}